

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall VBW::ConvexCell::compute_mg(ConvexCell *this,double *m,vec3 *result)

{
  uint uVar1;
  pointer pvVar2;
  pointer pTVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ushort uVar8;
  uint uVar9;
  pointer puVar10;
  pointer pvVar11;
  pointer pTVar12;
  pointer pTVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  ushort uVar26;
  ulong uVar27;
  ulong uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  ushort t1t2 [2];
  ushort local_7c [2];
  ConvexCell *local_78;
  string local_70;
  string local_50;
  
  result->x = 0.0;
  result->y = 0.0;
  result->z = 0.0;
  *m = 0.0;
  uVar9 = this->nb_v_;
  if ((ulong)uVar9 != 0) {
    puVar10 = (this->v2t_).
              super_vector<unsigned_short,_GEO::Memory::aligned_allocator<unsigned_short,_64>_>.
              super__Vector_base<unsigned_short,_GEO::Memory::aligned_allocator<unsigned_short,_64>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar27 = 0;
    uVar24 = 0x3fff;
    do {
      uVar8 = puVar10[uVar27];
      uVar25 = uVar24;
      if ((uVar8 != 0x3fff) && (uVar25 = (ulong)uVar8, (int)uVar24 != 0x3fff)) {
        pvVar11 = (this->triangle_point_).
                  super_vector<GEO::vecng<3U,_double>,_GEO::Memory::aligned_allocator<GEO::vecng<3U,_double>,_64>_>
                  .
                  super__Vector_base<GEO::vecng<3U,_double>,_GEO::Memory::aligned_allocator<GEO::vecng<3U,_double>,_64>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = pvVar11 + uVar24;
        pTVar12 = (this->t_).
                  super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                  .
                  super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar13 = (this->t_adj_).
                  super_vector<VBW::Triangle,_GEO::Memory::aligned_allocator<VBW::Triangle,_64>_>.
                  super__Vector_base<VBW::Triangle,_GEO::Memory::aligned_allocator<VBW::Triangle,_64>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar28 = 0;
        uVar26 = uVar8;
        do {
          if (uVar28 < 2) {
            local_7c[uVar28] = uVar26;
          }
          else {
            dVar4 = pvVar2->z;
            dVar5 = pvVar11[local_7c[0]].z;
            dVar6 = pvVar11[local_7c[1]].z;
            dVar29 = dVar5 - dVar4;
            dVar30 = dVar6 - dVar4;
            dVar15 = pvVar2->x;
            dVar16 = pvVar2->y;
            dVar17 = pvVar11[local_7c[0]].x;
            dVar18 = pvVar11[local_7c[0]].y;
            dVar19 = pvVar11[local_7c[1]].x;
            dVar20 = pvVar11[local_7c[1]].y;
            dVar31 = dVar17 - dVar15;
            dVar32 = dVar18 - dVar16;
            dVar33 = dVar19 - dVar15;
            dVar34 = dVar20 - dVar16;
            dVar7 = pvVar11[uVar26].z;
            dVar21 = pvVar11[uVar26].x;
            dVar22 = pvVar11[uVar26].y;
            dVar29 = ABS((dVar32 * dVar30 - dVar34 * dVar29) * (dVar21 - dVar15) +
                         (dVar29 * dVar33 - dVar30 * dVar31) * (dVar22 - dVar16) +
                         (dVar34 * dVar31 - dVar33 * dVar32) * (dVar7 - dVar4)) / 6.0;
            *m = *m + dVar29;
            result->x = result->x + dVar29 * (dVar15 + dVar17 + dVar19 + dVar21) * 0.25;
            result->y = result->y + dVar29 * (dVar16 + dVar18 + dVar20 + dVar22) * 0.25;
            result->z = (dVar4 + dVar5 + dVar6 + dVar7) * dVar29 * 0.25 + result->z;
            local_7c[1] = uVar26;
            if (uVar28 == 99999) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              local_78 = this;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"count < 100000","");
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                         ,"");
              GEO::geo_assertion_failed(&local_50,&local_70,0x6f32);
            }
          }
          pTVar3 = pTVar12 + uVar26;
          uVar1._0_2_ = (pTVar3->super_Triangle).i;
          uVar1._2_2_ = (pTVar3->super_Triangle).j;
          iVar23 = (uint)(uVar1 >> 0x10 == uVar27) +
                   (uint)(uVar27 == pTVar12[uVar26].super_Triangle.k) * 2;
          uVar1 = iVar23 + 1;
          uVar14 = iVar23 - 2;
          if (uVar1 < 3) {
            uVar14 = uVar1;
          }
          uVar26 = (&pTVar13[uVar26].i)[uVar14];
          uVar28 = uVar28 + 1;
          uVar25 = uVar24;
        } while (uVar26 != uVar8);
      }
      uVar27 = uVar27 + 1;
      uVar24 = uVar25;
    } while (uVar27 != uVar9);
  }
  return;
}

Assistant:

void ConvexCell::compute_mg(double& m, vec3& result) const {
	vbw_assert(!geometry_dirty_);
	result = make_vec3(0.0, 0.0, 0.0);
	m = 0.0;

	ushort t_origin = END_OF_LIST;
	for(index_t v=0; v<nb_v_; ++v) {
	    if(v2t_[v] == END_OF_LIST) {
		continue;
	    }
	    if(t_origin == END_OF_LIST) {
		t_origin = v2t_[v];
		continue;
	    }
	    ushort t1t2[2];
	    index_t cur=0;
	    index_t t = v2t_[v];
	    index_t count = 0;
	    do {
		if(cur < 2) {
		    t1t2[cur] = ushort(t);
		} else {
		    vec3 p = triangle_point_[t_origin];
		    vec3 q = triangle_point_[t1t2[0]];
		    vec3 r = triangle_point_[t1t2[1]];
		    vec3 s = triangle_point_[t];
		    double cur_m = tet_volume(p,q,r,s);
		    m += cur_m;
		    result.x += cur_m*(p.x + q.x + r.x + s.x)/4.0;
		    result.y += cur_m*(p.y + q.y + r.y + s.y)/4.0;
		    result.z += cur_m*(p.z + q.z + r.z + s.z)/4.0;
		    t1t2[1] = ushort(t);
		}
		++cur;
		index_t lv = triangle_find_vertex(t,v);		   
		t = triangle_adjacent(t, (lv + 1)%3);
		++count;
		geo_assert(count < 100000);
	    } while(t != v2t_[v]);
	}
    }